

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_streambuf.cpp
# Opt level: O3

int main(void)

{
  undefined8 uVar1;
  int iVar2;
  ostream *poVar3;
  long *plVar4;
  long lVar5;
  io_device iVar6;
  bool bVar7;
  input id;
  string s;
  istream in;
  string test;
  input id_7;
  output od;
  streambuf buf;
  undefined1 auStack_3d8 [8];
  string **local_3d0;
  undefined8 local_3c8;
  string *local_3c0 [2];
  io_device local_3b0;
  ulong local_3a8;
  string *local_3a0 [16];
  long local_320;
  undefined8 local_318;
  ios_base local_310 [8];
  ios_base local_308 [8];
  byte abStack_300 [256];
  io_device local_200;
  ulong local_1f8;
  _func_int *p_Stack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined **local_170;
  undefined8 local_168;
  string *local_160;
  undefined **local_158;
  undefined8 local_150;
  string *local_148;
  io_device local_140;
  ios_base local_138 [24];
  byte abStack_120 [240];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing input device",0x14);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
  std::ostream::put('\x10');
  std::ostream::flush();
  local_200._vptr_io_device = &p_Stack_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"Hello World\ndone","");
  local_3d0 = (string **)&PTR_read_00109c50;
  local_3c8 = 0;
  local_3c0[0] = (string *)&local_200;
  booster::streambuf::streambuf((streambuf *)&local_140);
  booster::streambuf::device(&local_140);
  std::istream::istream((istream *)&local_320,(streambuf *)&local_140);
  local_3b0._vptr_io_device = (_func_int **)local_3a0;
  local_3a8 = 0;
  local_3a0[0] = (string *)((ulong)local_3a0[0] & 0xffffffffffffff00);
  std::operator>>((istream *)&local_320,(string *)&local_3b0);
  tests = tests + 1;
  iVar2 = std::__cxx11::string::compare((char *)&local_3b0);
  if (iVar2 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," s==\"Hello\"",0xb);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," in ",4);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,0x79);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," failed",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    errors = errors + 1;
  }
  std::operator>>((istream *)&local_320,(string *)&local_3b0);
  tests = tests + 1;
  iVar2 = std::__cxx11::string::compare((char *)&local_3b0);
  if (iVar2 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," s==\"World\"",0xb);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," in ",4);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,0x7b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," failed",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    errors = errors + 1;
  }
  std::operator>>((istream *)&local_320,(string *)&local_3b0);
  tests = tests + 1;
  iVar2 = std::__cxx11::string::compare((char *)&local_3b0);
  if (iVar2 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," s==\"done\"",10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," in ",4);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,0x7d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," failed",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    errors = errors + 1;
  }
  tests = tests + 1;
  if ((abStack_300[*(long *)(local_320 + -0x18)] & 2) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," in.eof()",9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," in ",4);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,0x7e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," failed",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    errors = errors + 1;
  }
  if ((string **)local_3b0._vptr_io_device != local_3a0) {
    operator_delete(local_3b0._vptr_io_device);
  }
  uVar1 = __ITM_deregisterTMCloneTable;
  lVar5 = _VTT;
  local_320 = _VTT;
  *(undefined8 *)((long)&local_320 + *(long *)(_VTT + -0x18)) = __ITM_deregisterTMCloneTable;
  local_318 = 0;
  std::ios_base::~ios_base(local_310);
  booster::streambuf::~streambuf((streambuf *)&local_140);
  if (local_200._vptr_io_device != &p_Stack_1f0) {
    operator_delete(local_200._vptr_io_device);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing input device, small buffer",0x22);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
  std::ostream::put('\x10');
  std::ostream::flush();
  local_200._vptr_io_device = &p_Stack_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"Hello World\ndone","");
  local_3d0 = (string **)&PTR_read_00109c50;
  local_3c8 = 0;
  local_3c0[0] = (string *)&local_200;
  booster::streambuf::streambuf((streambuf *)&local_140);
  booster::streambuf::set_buffer_size((ulong)&local_140);
  booster::streambuf::device(&local_140);
  std::istream::istream((istream *)&local_320,(streambuf *)&local_140);
  local_3b0._vptr_io_device = (_func_int **)local_3a0;
  local_3a8 = 0;
  local_3a0[0] = (string *)((ulong)local_3a0[0] & 0xffffffffffffff00);
  std::operator>>((istream *)&local_320,(string *)&local_3b0);
  tests = tests + 1;
  iVar2 = std::__cxx11::string::compare((char *)&local_3b0);
  if (iVar2 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," s==\"Hello\"",0xb);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," in ",4);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,0x8a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," failed",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    errors = errors + 1;
  }
  std::operator>>((istream *)&local_320,(string *)&local_3b0);
  tests = tests + 1;
  iVar2 = std::__cxx11::string::compare((char *)&local_3b0);
  if (iVar2 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," s==\"World\"",0xb);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," in ",4);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,0x8c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," failed",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    errors = errors + 1;
  }
  std::operator>>((istream *)&local_320,(string *)&local_3b0);
  tests = tests + 1;
  iVar2 = std::__cxx11::string::compare((char *)&local_3b0);
  if (iVar2 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," s==\"done\"",10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," in ",4);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,0x8e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," failed",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    errors = errors + 1;
  }
  tests = tests + 1;
  if ((abStack_300[*(long *)(local_320 + -0x18)] & 2) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," in.eof()",9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," in ",4);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,0x8f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," failed",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    errors = errors + 1;
  }
  if ((string **)local_3b0._vptr_io_device != local_3a0) {
    operator_delete(local_3b0._vptr_io_device);
  }
  local_320 = lVar5;
  *(undefined8 *)((long)&local_320 + *(long *)(lVar5 + -0x18)) = uVar1;
  local_318 = 0;
  std::ios_base::~ios_base(local_310);
  booster::streambuf::~streambuf((streambuf *)&local_140);
  if (local_200._vptr_io_device != &p_Stack_1f0) {
    operator_delete(local_200._vptr_io_device);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing input device, putback",0x1d);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
  std::ostream::put('\x10');
  std::ostream::flush();
  local_200._vptr_io_device = &p_Stack_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"Hello World\ndone","");
  local_3d0 = (string **)&PTR_read_00109c50;
  local_3c8 = 0;
  local_3c0[0] = (string *)&local_200;
  booster::streambuf::streambuf((streambuf *)&local_140);
  booster::streambuf::set_buffer_size((ulong)&local_140);
  booster::streambuf::device(&local_140);
  std::istream::istream((istream *)&local_320,(streambuf *)&local_140);
  local_3b0._vptr_io_device = (_func_int **)local_3a0;
  local_3a8 = 0;
  local_3a0[0] = (string *)((ulong)local_3a0[0] & 0xffffffffffffff00);
  tests = tests + 1;
  iVar2 = std::istream::get();
  if (iVar2 != 0x48) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," in.get() == \'H\'",0x10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," in ",4);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,0x9a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," failed",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    errors = errors + 1;
  }
  tests = tests + 1;
  iVar2 = std::istream::get();
  if (iVar2 != 0x65) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," in.get() == \'e\'",0x10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," in ",4);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,0x9b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," failed",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    errors = errors + 1;
  }
  tests = tests + 1;
  iVar2 = std::istream::get();
  if (iVar2 != 0x6c) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," in.get() == \'l\'",0x10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," in ",4);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,0x9c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," failed",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    errors = errors + 1;
  }
  tests = tests + 1;
  iVar2 = std::istream::get();
  if (iVar2 != 0x6c) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," in.get() == \'l\'",0x10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," in ",4);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,0x9d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," failed",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    errors = errors + 1;
  }
  tests = tests + 1;
  plVar4 = (long *)std::istream::putback((char)&local_320);
  if ((*(byte *)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0x20) & 5) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," in.putback(\'l\')",0x10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," in ",4);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,0x9e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," failed",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    errors = errors + 1;
  }
  tests = tests + 1;
  plVar4 = (long *)std::istream::putback((char)&local_320);
  if ((*(byte *)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0x20) & 5) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," in.putback(\'l\')",0x10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," in ",4);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,0x9f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," failed",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    errors = errors + 1;
  }
  tests = tests + 1;
  plVar4 = (long *)std::istream::putback((char)&local_320);
  if ((*(byte *)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0x20) & 5) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," in.putback(\'e\')",0x10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," in ",4);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,0xa0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," failed",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    errors = errors + 1;
  }
  tests = tests + 1;
  iVar2 = std::istream::get();
  if (iVar2 != 0x65) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," in.get() == \'e\'",0x10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," in ",4);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,0xa1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," failed",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    errors = errors + 1;
  }
  tests = tests + 1;
  iVar2 = std::istream::get();
  if (iVar2 != 0x6c) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," in.get() == \'l\'",0x10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," in ",4);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,0xa2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," failed",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    errors = errors + 1;
  }
  tests = tests + 1;
  iVar2 = std::istream::get();
  if (iVar2 != 0x6c) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," in.get() == \'l\'",0x10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," in ",4);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,0xa3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," failed",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    errors = errors + 1;
  }
  tests = tests + 1;
  iVar2 = std::istream::get();
  if (iVar2 != 0x6f) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," in.get() == \'o\'",0x10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," in ",4);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,0xa4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," failed",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    errors = errors + 1;
  }
  tests = tests + 1;
  plVar4 = (long *)std::istream::putback((char)&local_320);
  if ((*(byte *)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0x20) & 5) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," in.putback(\'o\')",0x10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," in ",4);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,0xa5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," failed",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    errors = errors + 1;
  }
  tests = tests + 1;
  iVar2 = std::istream::get();
  if (iVar2 != 0x6f) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," in.get() == \'o\'",0x10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," in ",4);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,0xa6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," failed",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    errors = errors + 1;
  }
  tests = tests + 1;
  iVar2 = std::istream::get();
  if (iVar2 != 0x20) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," in.get() == \' \'",0x10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," in ",4);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,0xa7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," failed",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    errors = errors + 1;
  }
  tests = tests + 1;
  plVar4 = (long *)std::istream::unget();
  if ((*(byte *)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0x20) & 5) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," in.unget()",0xb);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," in ",4);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,0xa8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," failed",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    errors = errors + 1;
  }
  tests = tests + 1;
  iVar2 = std::istream::get();
  if (iVar2 != 0x20) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," in.get() == \' \'",0x10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," in ",4);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,0xa9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," failed",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    errors = errors + 1;
  }
  tests = tests + 1;
  plVar4 = (long *)std::istream::putback((char)&local_320);
  if ((*(byte *)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0x20) & 5) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," !in.putback(\'x\')",0x11);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," in ",4);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,0xaa);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," failed",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    errors = errors + 1;
  }
  if ((string **)local_3b0._vptr_io_device != local_3a0) {
    operator_delete(local_3b0._vptr_io_device);
  }
  local_320 = lVar5;
  *(undefined8 *)((long)&local_320 + *(long *)(lVar5 + -0x18)) = uVar1;
  local_318 = 0;
  std::ios_base::~ios_base(local_310);
  booster::streambuf::~streambuf((streambuf *)&local_140);
  if (local_200._vptr_io_device != &p_Stack_1f0) {
    operator_delete(local_200._vptr_io_device);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing input device, putback fail",0x22);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
  std::ostream::put('\x10');
  std::ostream::flush();
  local_200._vptr_io_device = &p_Stack_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"Hello World\ndone","");
  local_3d0 = (string **)&PTR_read_00109c50;
  local_3c8 = 0;
  local_3c0[0] = (string *)&local_200;
  booster::streambuf::streambuf((streambuf *)&local_140);
  booster::streambuf::set_buffer_size((ulong)&local_140);
  booster::streambuf::device(&local_140);
  std::istream::istream((istream *)&local_320,(streambuf *)&local_140);
  local_3b0._vptr_io_device = (_func_int **)local_3a0;
  local_3a8 = 0;
  local_3a0[0] = (string *)((ulong)local_3a0[0] & 0xffffffffffffff00);
  tests = tests + 1;
  iVar2 = std::istream::get();
  if (iVar2 != 0x48) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," in.get() == \'H\'",0x10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," in ",4);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,0xb5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," failed",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    errors = errors + 1;
  }
  tests = tests + 1;
  iVar2 = std::istream::get();
  if (iVar2 != 0x65) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," in.get() == \'e\'",0x10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," in ",4);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,0xb6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," failed",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    errors = errors + 1;
  }
  tests = tests + 1;
  iVar2 = std::istream::get();
  if (iVar2 != 0x6c) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," in.get() == \'l\'",0x10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," in ",4);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,0xb7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," failed",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    errors = errors + 1;
  }
  tests = tests + 1;
  iVar2 = std::istream::get();
  if (iVar2 != 0x6c) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," in.get() == \'l\'",0x10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," in ",4);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,0xb8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," failed",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    errors = errors + 1;
  }
  tests = tests + 1;
  plVar4 = (long *)std::istream::unget();
  if ((*(byte *)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0x20) & 5) == 0) {
    plVar4 = (long *)std::istream::unget();
    if ((*(byte *)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0x20) & 5) == 0) {
      plVar4 = (long *)std::istream::unget();
      if ((*(byte *)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0x20) & 5) == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr," !in.unget() || !in.unget() || !in.unget()",0x2a);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," in ",4);
        poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,0xb9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," failed",7);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
        errors = errors + 1;
      }
    }
  }
  if ((string **)local_3b0._vptr_io_device != local_3a0) {
    operator_delete(local_3b0._vptr_io_device);
  }
  local_320 = lVar5;
  *(undefined8 *)((long)&local_320 + *(long *)(lVar5 + -0x18)) = uVar1;
  local_318 = 0;
  std::ios_base::~ios_base(local_310);
  booster::streambuf::~streambuf((streambuf *)&local_140);
  if (local_200._vptr_io_device != &p_Stack_1f0) {
    operator_delete(local_200._vptr_io_device);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing output device",0x15);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
  std::ostream::put('\x10');
  std::ostream::flush();
  local_1f8 = 0;
  p_Stack_1f0 = (_func_int *)((ulong)p_Stack_1f0 & 0xffffffffffffff00);
  local_3b0._vptr_io_device = (_func_int **)&PTR_read_00109cb0;
  local_3a8 = 5;
  local_3a0[0] = (string *)&local_200;
  local_200._vptr_io_device = &p_Stack_1f0;
  booster::streambuf::streambuf((streambuf *)&local_140);
  booster::streambuf::device(&local_140);
  std::ostream::ostream(&local_320,(streambuf *)&local_140);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_320,"test",4);
  tests = tests + 1;
  iVar2 = std::__cxx11::string::compare((char *)&local_200);
  if (iVar2 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," test==\"\"",9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," in ",4);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,0xc3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," failed",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    errors = errors + 1;
  }
  std::ostream::flush();
  tests = tests + 1;
  iVar2 = std::__cxx11::string::compare((char *)&local_200);
  if (iVar2 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," test==\"test\"",0xd);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," in ",4);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,0xc5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," failed",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    errors = errors + 1;
  }
  tests = tests + 1;
  if ((abStack_300[*(long *)(local_320 + -0x18)] & 5) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," out",4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," in ",4);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,0xc6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," failed",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    errors = errors + 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_320,"ab",2);
  std::ostream::flush();
  tests = tests + 1;
  if ((abStack_300[*(long *)(local_320 + -0x18)] & 5) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," !out",5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," in ",4);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,200);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," failed",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    errors = errors + 1;
  }
  tests = tests + 1;
  iVar2 = std::__cxx11::string::compare((char *)&local_200);
  if (iVar2 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," test==\"testa\"",0xe)
    ;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," in ",4);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,0xc9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," failed",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    errors = errors + 1;
  }
  std::ios_base::~ios_base((ios_base *)&local_318);
  booster::streambuf::~streambuf((streambuf *)&local_140);
  if (local_200._vptr_io_device != &p_Stack_1f0) {
    operator_delete(local_200._vptr_io_device);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing output device, small buffer size",0x28);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
  std::ostream::put('\x10');
  std::ostream::flush();
  local_1f8 = 0;
  p_Stack_1f0 = (_func_int *)((ulong)p_Stack_1f0 & 0xffffffffffffff00);
  local_3d0 = (string **)&PTR_read_00109cb0;
  local_3c8 = 0xffffffffffffffff;
  local_3c0[0] = (string *)&local_200;
  local_200._vptr_io_device = &p_Stack_1f0;
  booster::streambuf::streambuf((streambuf *)&local_140);
  booster::streambuf::set_buffer_size((ulong)&local_140);
  booster::streambuf::device(&local_140);
  std::ostream::ostream(&local_320,(streambuf *)&local_140);
  local_3b0._vptr_io_device = (_func_int **)local_3a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3b0,"To be or not to be, that is the question!","");
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_320,(char *)local_3b0._vptr_io_device,local_3a8);
  tests = tests + 1;
  if (local_1f8 < local_3a8 - 3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," test_msg.size() - 3 <= test.size()",0x23);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," in ",4);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,0xd5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," failed",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    errors = errors + 1;
  }
  tests = tests + 1;
  if (local_3a8 < local_1f8) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," test.size() <= test_msg.size()",0x1f);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," in ",4);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,0xd6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," failed",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    errors = errors + 1;
  }
  std::ostream::flush();
  iVar6._vptr_io_device = local_3b0._vptr_io_device;
  tests = tests + 1;
  if (local_1f8 == local_3a8) {
    if (local_1f8 == 0) goto LAB_001054a5;
    iVar2 = bcmp(local_200._vptr_io_device,local_3b0._vptr_io_device,local_1f8);
    if (iVar2 == 0) goto LAB_001054a5;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," test==test_msg",0xf);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," in ",4);
  poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,0xd8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," failed",7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  errors = errors + 1;
  iVar6._vptr_io_device = local_3b0._vptr_io_device;
LAB_001054a5:
  if ((string **)iVar6._vptr_io_device != local_3a0) {
    operator_delete(iVar6._vptr_io_device);
  }
  std::ios_base::~ios_base((ios_base *)&local_318);
  booster::streambuf::~streambuf((streambuf *)&local_140);
  if (local_200._vptr_io_device != &p_Stack_1f0) {
    operator_delete(local_200._vptr_io_device);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing output device, reset",0x1c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
  std::ostream::put('\x10');
  std::ostream::flush();
  local_1f8 = 0;
  p_Stack_1f0 = (_func_int *)((ulong)p_Stack_1f0 & 0xffffffffffffff00);
  local_3b0._vptr_io_device = (_func_int **)&PTR_read_00109cb0;
  local_3a8 = 0xffffffffffffffff;
  local_3a0[0] = (string *)&local_200;
  local_200._vptr_io_device = &p_Stack_1f0;
  booster::streambuf::streambuf((streambuf *)&local_140);
  booster::streambuf::device(&local_140);
  std::ostream::ostream(&local_320,(streambuf *)&local_140);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_320,"test",4);
  booster::streambuf::reset_device();
  tests = tests + 1;
  iVar2 = std::__cxx11::string::compare((char *)&local_200);
  if (iVar2 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," test==\"test\"",0xd);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," in ",4);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,0xe3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," failed",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    errors = errors + 1;
  }
  std::ios_base::~ios_base((ios_base *)&local_318);
  booster::streambuf::~streambuf((streambuf *)&local_140);
  if (local_200._vptr_io_device != &p_Stack_1f0) {
    operator_delete(local_200._vptr_io_device);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing seek fault",0x12);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
  std::ostream::put('\x10');
  std::ostream::flush();
  local_3d0 = local_3c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"foo","");
  local_158 = &PTR_read_00109cb0;
  local_150 = 0xffffffffffffffff;
  local_170 = &PTR_read_00109c50;
  local_168 = 0;
  local_160 = (string *)&local_3d0;
  local_148 = (string *)&local_3d0;
  booster::streambuf::streambuf((streambuf *)&local_200);
  booster::streambuf::device(&local_200);
  booster::streambuf::streambuf((streambuf *)&local_3b0);
  booster::streambuf::device(&local_3b0);
  std::istream::istream((istream *)&local_320,(streambuf *)&local_3b0);
  std::ostream::ostream(&local_140,(streambuf *)&local_200);
  tests = tests + 1;
  if ((abStack_300[*(long *)(local_320 + -0x18)] & 5) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," in",3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," in ",4);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,0xf0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," failed",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    errors = errors + 1;
  }
  tests = tests + 1;
  if ((abStack_120[(long)local_140._vptr_io_device[-3]] & 5) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," out",4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," in ",4);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,0xf1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," failed",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    errors = errors + 1;
  }
  std::istream::seekg(&local_320,0,0);
  tests = tests + 1;
  if ((abStack_300[*(long *)(local_320 + -0x18)] & 5) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," !in",4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," in ",4);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,0xf3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," failed",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    errors = errors + 1;
  }
  std::ostream::seekp(&local_140,0,0);
  tests = tests + 1;
  if ((abStack_120[(long)local_140._vptr_io_device[-3]] & 5) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," !out",5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," in ",4);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,0xf5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," failed",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    errors = errors + 1;
  }
  std::ios_base::~ios_base(local_138);
  local_320 = lVar5;
  *(undefined8 *)((long)&local_320 + *(long *)(lVar5 + -0x18)) = uVar1;
  local_318 = 0;
  std::ios_base::~ios_base(local_310);
  booster::streambuf::~streambuf((streambuf *)&local_3b0);
  booster::streambuf::~streambuf((streambuf *)&local_200);
  if (local_3d0 != local_3c0) {
    operator_delete(local_3d0);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing tell fault",0x12);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
  std::ostream::put('\x10');
  std::ostream::flush();
  local_3d0 = local_3c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"foo","");
  local_158 = &PTR_read_00109cb0;
  local_150 = 0xffffffffffffffff;
  local_170 = &PTR_read_00109c50;
  local_168 = 0;
  local_160 = (string *)&local_3d0;
  local_148 = (string *)&local_3d0;
  booster::streambuf::streambuf((streambuf *)&local_200);
  booster::streambuf::device(&local_200);
  booster::streambuf::streambuf((streambuf *)&local_3b0);
  booster::streambuf::device(&local_3b0);
  std::istream::istream((istream *)&local_320,(streambuf *)&local_3b0);
  std::ostream::ostream(&local_140,(streambuf *)&local_200);
  tests = tests + 1;
  if ((abStack_300[*(long *)(local_320 + -0x18)] & 5) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," in",3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," in ",4);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,0x102);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," failed",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    errors = errors + 1;
  }
  tests = tests + 1;
  if ((abStack_120[(long)local_140._vptr_io_device[-3]] & 5) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," out",4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," in ",4);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,0x103);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," failed",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    errors = errors + 1;
  }
  tests = tests + 1;
  iVar2 = std::istream::tellg();
  if (iVar2 != -1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," int(in.tellg())==-1",0x14);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," in ",4);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,0x104);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," failed",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    errors = errors + 1;
  }
  tests = tests + 1;
  iVar2 = std::ostream::tellp();
  if (iVar2 != -1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," int(out.tellp())==-1",0x15);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," in ",4);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,0x105);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," failed",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    errors = errors + 1;
  }
  std::ios_base::~ios_base(local_138);
  local_320 = lVar5;
  *(undefined8 *)((long)&local_320 + *(long *)(lVar5 + -0x18)) = uVar1;
  local_318 = 0;
  std::ios_base::~ios_base(local_310);
  booster::streambuf::~streambuf((streambuf *)&local_3b0);
  booster::streambuf::~streambuf((streambuf *)&local_200);
  if (local_3d0 != local_3c0) {
    operator_delete(local_3d0);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing random access device",0x1c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
  std::ostream::put('\x10');
  std::ostream::flush();
  local_200._vptr_io_device = (_func_int **)&PTR_read_00109d00;
  local_1f8 = 0;
  p_Stack_1f0 = (_func_int *)0x0;
  local_1e8 = 0;
  uStack_1e0 = 0;
  booster::streambuf::streambuf((streambuf *)&local_140);
  booster::streambuf::device(&local_140);
  std::iostream::iostream((iostream *)&local_320,(streambuf *)&local_140);
  tests = tests + 1;
  iVar2 = std::istream::tellg();
  if (iVar2 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," int(io.tellg())==0",0x13);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," in ",4);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,0x10e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," failed",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    errors = errors + 1;
  }
  tests = tests + 1;
  iVar2 = std::ostream::tellp();
  if (iVar2 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," int(io.tellp())==0",0x13);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," in ",4);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,0x10f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," failed",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    errors = errors + 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_310,"test",4);
  tests = tests + 1;
  iVar2 = std::istream::tellg();
  if (iVar2 != 4) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," int(io.tellg())==4",0x13);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," in ",4);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,0x111);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," failed",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    errors = errors + 1;
  }
  tests = tests + 1;
  iVar2 = std::ostream::tellp();
  if (iVar2 != 4) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," int(io.tellp())==4",0x13);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," in ",4);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,0x112);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," failed",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    errors = errors + 1;
  }
  tests = tests + 1;
  if ((abStack_300[*(long *)(local_320 + -0x18)] & 5) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," io",3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," in ",4);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,0x113);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," failed",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    errors = errors + 1;
  }
  tests = tests + 1;
  plVar4 = (long *)std::ostream::seekp((ostream *)local_310,1,0);
  if ((*(byte *)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0x20) & 5) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," io.seekp(1)",0xc);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," in ",4);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,0x114);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," failed",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    errors = errors + 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_310,"x",1);
  tests = tests + 1;
  iVar2 = std::ostream::tellp();
  if (iVar2 != 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," int(io.tellp())==2",0x13);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," in ",4);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,0x116);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," failed",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    errors = errors + 1;
  }
  tests = tests + 1;
  plVar4 = (long *)std::istream::seekg(&local_320,0,0);
  if ((*(byte *)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0x20) & 5) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," io.seekg(0)",0xc);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," in ",4);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,0x117);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," failed",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    errors = errors + 1;
  }
  tests = tests + 1;
  if ((abStack_300[*(long *)(local_320 + -0x18)] & 5) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," io",3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," in ",4);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,0x118);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," failed",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    errors = errors + 1;
  }
  local_3b0._vptr_io_device = (_func_int **)local_3a0;
  local_3a8 = 0;
  local_3a0[0] = (string *)((ulong)local_3a0[0] & 0xffffffffffffff00);
  std::operator>>((istream *)&local_320,(string *)&local_3b0);
  tests = tests + 1;
  iVar2 = std::__cxx11::string::compare((char *)&local_3b0);
  if (iVar2 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," tmp==\"txst\"",0xc);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," in ",4);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,0x11b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," failed",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    errors = errors + 1;
  }
  tests = tests + 1;
  lVar5 = *(long *)(local_320 + -0x18);
  if ((abStack_300[lVar5] & 5) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," io",3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," in ",4);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,0x11c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," failed",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    errors = errors + 1;
    lVar5 = *(long *)(local_320 + -0x18);
  }
  std::ios::clear((int)auStack_3d8 + (int)lVar5 + 0xb8);
  tests = tests + 1;
  iVar2 = std::istream::tellg();
  if (iVar2 != 4) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," int(io.tellg())==4",0x13);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," in ",4);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,0x11e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," failed",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    errors = errors + 1;
  }
  tests = tests + 1;
  iVar2 = std::ostream::tellp();
  if (iVar2 != 4) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," int(io.tellp())==4",0x13);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," in ",4);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,0x11f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," failed",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    errors = errors + 1;
  }
  std::ios::clear((int)&local_320 + (int)*(undefined8 *)(local_320 + -0x18));
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_310,"xxxx",4);
  tests = tests + 1;
  if ((abStack_300[*(long *)(local_320 + -0x18)] & 5) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," io",3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," in ",4);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,0x122);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," failed",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    errors = errors + 1;
  }
  tests = tests + 1;
  iVar2 = std::ostream::tellp();
  if (iVar2 != 8) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," int(io.tellp())==8",0x13);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," in ",4);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,0x123);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," failed",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    errors = errors + 1;
  }
  tests = tests + 1;
  iVar2 = std::istream::tellg();
  if (iVar2 != 8) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," int(io.tellg())==8",0x13);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," in ",4);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,0x124);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," failed",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    errors = errors + 1;
  }
  tests = tests + 1;
  plVar4 = (long *)std::istream::seekg(&local_320,0,0);
  if ((*(byte *)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0x20) & 5) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," io.seekg(0)",0xc);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," in ",4);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,0x125);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," failed",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    errors = errors + 1;
  }
  std::operator>>((istream *)&local_320,(string *)&local_3b0);
  tests = tests + 1;
  iVar2 = std::__cxx11::string::compare((char *)&local_3b0);
  if (iVar2 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," tmp==\"txstxxxx\"",0x10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," in ",4);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,0x127);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," failed",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    errors = errors + 1;
  }
  if ((string **)local_3b0._vptr_io_device != local_3a0) {
    operator_delete(local_3b0._vptr_io_device);
  }
  local_320 = _set_buffer_size;
  *(undefined8 *)((long)&local_320 + *(long *)(_set_buffer_size + -0x18)) = _flush;
  local_318 = 0;
  std::ios_base::~ios_base(local_308);
  booster::streambuf::~streambuf((streambuf *)&local_140);
  local_200._vptr_io_device = (_func_int **)&PTR_read_00109d00;
  if (p_Stack_1f0 != (_func_int *)0x0) {
    operator_delete(p_Stack_1f0);
  }
  bVar7 = errors == 0;
  if (bVar7) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ok, passed ",0xb);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cout,tests);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," tests ",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Fail: passed ",0xd);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,tests - errors);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," tests ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," failed ",8);
    plVar4 = (long *)std::ostream::operator<<(poVar3,errors);
    std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
    std::ostream::put((char)plVar4);
    std::ostream::flush();
  }
  return (uint)!bVar7;
}

Assistant:

int main()
{
	try {
		{
			std::cout << "Testing input device" << std::endl;
			std::string test("Hello World\ndone");
			input id(&test);
			booster::streambuf buf;
			buf.device(id);
			std::istream in(&buf);
			std::string s;
			in >> s ;
			TEST(s=="Hello");
			in >> s;
			TEST(s=="World");
			in >> s;
			TEST(s=="done");
			TEST(in.eof());
		}
		{
			std::cout << "Testing input device, small buffer" << std::endl;
			std::string test("Hello World\ndone");
			input id(&test);
			booster::streambuf buf;
			buf.set_buffer_size(2);
			buf.device(id);
			std::istream in(&buf);
			std::string s;
			in >> s ;
			TEST(s=="Hello");
			in >> s;
			TEST(s=="World");
			in >> s;
			TEST(s=="done");
			TEST(in.eof());
		}
		{
			std::cout << "Testing input device, putback" << std::endl;
			std::string test("Hello World\ndone");
			input id(&test);
			booster::streambuf buf;
			buf.set_buffer_size(2);
			buf.device(id);
			std::istream in(&buf);
			std::string s;
			TEST(in.get() == 'H');
			TEST(in.get() == 'e');
			TEST(in.get() == 'l');
			TEST(in.get() == 'l');
			TEST(in.putback('l'));
			TEST(in.putback('l'));
			TEST(in.putback('e'));
			TEST(in.get() == 'e');
			TEST(in.get() == 'l');
			TEST(in.get() == 'l');
			TEST(in.get() == 'o');
			TEST(in.putback('o'));
			TEST(in.get() == 'o');
			TEST(in.get() == ' ');
			TEST(in.unget());
			TEST(in.get() == ' ');
			TEST(!in.putback('x'));
		}
		{
			std::cout << "Testing input device, putback fail" << std::endl;
			std::string test("Hello World\ndone");
			input id(&test);
			booster::streambuf buf;
			buf.set_buffer_size(2);
			buf.device(id);
			std::istream in(&buf);
			std::string s;
			TEST(in.get() == 'H');
			TEST(in.get() == 'e');
			TEST(in.get() == 'l');
			TEST(in.get() == 'l');
			TEST(!in.unget() || !in.unget() || !in.unget());
		}
		{
			std::cout << "Testing output device" << std::endl;
			std::string test;
			output id(&test,5);
			booster::streambuf buf;
			buf.device(id);
			std::ostream out(&buf);
			out << "test";
			TEST(test=="");
			out << std::flush;
			TEST(test=="test");
			TEST(out);
			out << "ab" << std::flush;
			TEST(!out);
			TEST(test=="testa");
		}
		{
			std::cout << "Testing output device, small buffer size" << std::endl;
			std::string test;
			output id(&test);
			booster::streambuf buf;
			buf.set_buffer_size(2);
			buf.device(id);
			std::ostream out(&buf);
			std::string test_msg = "To be or not to be, that is the question!";
			out << test_msg;
			TEST(test_msg.size() - 3 <= test.size());
			TEST(test.size() <= test_msg.size());
			out << std::flush;
			TEST(test==test_msg);
		}
		{
			std::cout << "Testing output device, reset" << std::endl;
			std::string test;
			output id(&test);
			booster::streambuf buf;
			buf.device(id);
			std::ostream out(&buf);
			out << "test";
			buf.reset_device();
			TEST(test=="test");
		}
		{
			std::cout << "Testing seek fault" << std::endl;
			std::string dummy="foo";
			output od(&dummy);
			input id(&dummy);
			booster::streambuf os;
			os.device(od);
			booster::streambuf is;
			is.device(id);
			std::istream in(&is);
			std::ostream out(&os);
			TEST(in);
			TEST(out);
			in.seekg(0);
			TEST(!in);
			out.seekp(0);
			TEST(!out);
		}
		{
			std::cout << "Testing tell fault" << std::endl;
			std::string dummy="foo";
			output od(&dummy);
			input id(&dummy);
			booster::streambuf os;
			os.device(od);
			booster::streambuf is;
			is.device(id);
			std::istream in(&is);
			std::ostream out(&os);
			TEST(in);
			TEST(out);
			TEST(int(in.tellg())==-1);
			TEST(int(out.tellp())==-1);
		}
		{
			std::cout << "Testing random access device" << std::endl;
			seekable sd;
			booster::streambuf buf;
			buf.device(sd);
			std::iostream io(&buf);
			
			TEST(int(io.tellg())==0);
			TEST(int(io.tellp())==0);
			io << "test";
			TEST(int(io.tellg())==4);
			TEST(int(io.tellp())==4);
			TEST(io);
			TEST(io.seekp(1));
			io << "x";
			TEST(int(io.tellp())==2);
			TEST(io.seekg(0));
			TEST(io);
			std::string tmp;
			io >> tmp;
			TEST(tmp=="txst");
			TEST(io);
			io.clear();
			TEST(int(io.tellg())==4);
			TEST(int(io.tellp())==4);
			io.clear();
			io << "xxxx";
			TEST(io);
			TEST(int(io.tellp())==8);
			TEST(int(io.tellg())==8);
			TEST(io.seekg(0));
			io >> tmp;
			TEST(tmp=="txstxxxx");
		}
	}
	catch(std::exception const &e) {
		std::cerr << e.what() << std::endl;
		return 1;
	}
	if(errors == 0) {
		std::cout << "ok, passed " << tests << " tests "<< std::endl;
		return 0;
	}
	else { 
		std::cerr << "Fail: passed " << tests - errors<< " tests " << " failed " << errors << std::endl;
		return 1;
	}

}